

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void LowerBinaryMemoryOperationIntoBlock
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,VmInstruction *inst,RegVmInstructionCode iCode,RegVmInstructionCode fCode,
               RegVmInstructionCode dCode,RegVmInstructionCode lCode)

{
  VmValue *pVVar1;
  VmInstruction *lowBlock_00;
  RegVmLoweredBlock *lowFunction_00;
  RegVmLoweredFunction *ctx_00;
  bool bVar2;
  VmValue **ppVVar3;
  VmConstant *argument;
  VmConstant *pVVar4;
  undefined1 local_60 [8];
  VmType type;
  uchar targetReg;
  VmConstant *loadType;
  VmConstant *constant;
  RegVmInstructionCode local_30;
  uchar addressReg;
  RegVmInstructionCode RStack_2c;
  uchar lhsReg;
  RegVmInstructionCode fCode_local;
  RegVmInstructionCode iCode_local;
  VmInstruction *inst_local;
  RegVmLoweredBlock *lowBlock_local;
  RegVmLoweredFunction *lowFunction_local;
  ExpressionContext *ctx_local;
  
  local_30 = fCode;
  RStack_2c = iCode;
  _fCode_local = inst;
  inst_local = (VmInstruction *)lowBlock;
  lowBlock_local = (RegVmLoweredBlock *)lowFunction;
  lowFunction_local = (RegVmLoweredFunction *)ctx;
  ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&inst->arguments,0);
  constant._7_1_ = GetArgumentRegister(ctx,lowFunction,lowBlock,*ppVVar3);
  ctx_00 = lowFunction_local;
  lowFunction_00 = lowBlock_local;
  lowBlock_00 = inst_local;
  constant._6_1_ = '\0';
  ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&_fCode_local->arguments,1);
  pVVar1 = *ppVVar3;
  ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&_fCode_local->arguments,2);
  argument = GetLoadRegisterAndOffset
                       ((ExpressionContext *)ctx_00,(RegVmLoweredFunction *)lowFunction_00,
                        (RegVmLoweredBlock *)lowBlock_00,pVVar1,*ppVVar3,
                        (uchar *)((long)&constant + 6));
  ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&_fCode_local->arguments,3);
  pVVar4 = getType<VmConstant>(*ppVVar3);
  type.structType._7_1_ =
       RegVmLoweredFunction::AllocateRegister
                 ((RegVmLoweredFunction *)lowBlock_local,&_fCode_local->super_VmValue,0,true);
  ppVVar3 = SmallArray<VmValue_*,_4U>::operator[](&_fCode_local->arguments,0);
  pVVar1 = *ppVVar3;
  local_60._0_4_ = (pVVar1->type).type;
  local_60._4_4_ = (pVVar1->type).size;
  type._0_8_ = (pVVar1->type).structType;
  bVar2 = VmType::operator==((VmType *)local_60,&VmType::Int);
  if (bVar2) {
    RegVmLoweredBlock::AddInstruction
              ((RegVmLoweredBlock *)inst_local,(ExpressionContext *)lowFunction_local,
               (_fCode_local->super_VmValue).source,RStack_2c,type.structType._7_1_,constant._7_1_,
               constant._6_1_,argument);
  }
  else {
    bVar2 = VmType::operator==((VmType *)local_60,&VmType::Double);
    if (((bVar2) && (pVVar4->iValue == 3)) && (local_30 != rviNop)) {
      RegVmLoweredBlock::AddInstruction
                ((RegVmLoweredBlock *)inst_local,(ExpressionContext *)lowFunction_local,
                 (_fCode_local->super_VmValue).source,local_30,type.structType._7_1_,constant._7_1_,
                 constant._6_1_,argument);
    }
    else {
      bVar2 = VmType::operator==((VmType *)local_60,&VmType::Double);
      if (((bVar2) && (pVVar4->iValue == 4)) && (dCode != rviNop)) {
        RegVmLoweredBlock::AddInstruction
                  ((RegVmLoweredBlock *)inst_local,(ExpressionContext *)lowFunction_local,
                   (_fCode_local->super_VmValue).source,dCode,type.structType._7_1_,constant._7_1_,
                   constant._6_1_,argument);
      }
      else {
        bVar2 = VmType::operator==((VmType *)local_60,&VmType::Long);
        if ((!bVar2) && (local_60._0_4_ != VM_TYPE_POINTER)) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0x2c0,
                        "void LowerBinaryMemoryOperationIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmInstruction *, RegVmInstructionCode, RegVmInstructionCode, RegVmInstructionCode, RegVmInstructionCode)"
                       );
        }
        RegVmLoweredBlock::AddInstruction
                  ((RegVmLoweredBlock *)inst_local,(ExpressionContext *)lowFunction_local,
                   (_fCode_local->super_VmValue).source,lCode,type.structType._7_1_,constant._7_1_,
                   constant._6_1_,argument);
      }
    }
  }
  return;
}

Assistant:

void LowerBinaryMemoryOperationIntoBlock(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, VmInstruction *inst, RegVmInstructionCode iCode, RegVmInstructionCode fCode, RegVmInstructionCode dCode, RegVmInstructionCode lCode)
{
	unsigned char lhsReg = GetArgumentRegister(ctx, lowFunction, lowBlock, inst->arguments[0]);
	unsigned char addressReg = 0;
	VmConstant *constant = GetLoadRegisterAndOffset(ctx, lowFunction, lowBlock, inst->arguments[1], inst->arguments[2], addressReg);
	VmConstant *loadType = getType<VmConstant>(inst->arguments[3]);
	unsigned char targetReg = lowFunction->AllocateRegister(inst);

	VmType type = inst->arguments[0]->type;

	if(type == VmType::Int || (type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4))
		lowBlock->AddInstruction(ctx, inst->source, iCode, targetReg, lhsReg, addressReg, constant);
	else if(type == VmType::Double && loadType->iValue == VM_INST_LOAD_FLOAT && fCode != rviNop)
		lowBlock->AddInstruction(ctx, inst->source, fCode, targetReg, lhsReg, addressReg, constant);
	else if(type == VmType::Double && loadType->iValue == VM_INST_LOAD_DOUBLE && dCode != rviNop)
		lowBlock->AddInstruction(ctx, inst->source, dCode, targetReg, lhsReg, addressReg, constant);
	else if(type == VmType::Long || (type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8))
		lowBlock->AddInstruction(ctx, inst->source, lCode, targetReg, lhsReg, addressReg, constant);
	else
		assert(!"unknown type");
}